

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateStFldWithCachedFinalType
          (Lowerer *this,Instr *instrStFld,PropertySymOpnd *propertySymOpnd)

{
  code *pcVar1;
  bool bVar2;
  PropertySymOpnd *pPVar3;
  undefined4 *puVar4;
  LabelInstr *labelTypeCheckFailed;
  JITTypeHolder initialType;
  LabelInstr *branchTarget;
  BranchInstr *instr;
  
  pPVar3 = IR::Opnd::AsPropertySymOpnd(instrStFld->m_dst);
  if (pPVar3 != propertySymOpnd) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2095,"(propertySymOpnd == instrStFld->GetDst()->AsPropertySymOpnd())",
                       "propertySymOpnd == instrStFld->GetDst()->AsPropertySymOpnd()");
    if (!bVar2) goto LAB_005cc693;
    *puVar4 = 0;
  }
  if (propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
LAB_005cc385:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2096,"(propertySymOpnd->IsMonoObjTypeSpecCandidate())",
                       "propertySymOpnd->IsMonoObjTypeSpecCandidate()");
    if (!bVar2) goto LAB_005cc693;
    *puVar4 = 0;
  }
  else {
    bVar2 = ObjTypeSpecFldInfo::IsMonoObjTypeSpecCandidate(propertySymOpnd->objTypeSpecFldInfo);
    if (!bVar2) goto LAB_005cc385;
  }
  bVar2 = IR::PropertySymOpnd::HasFinalType(propertySymOpnd);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2097,"(propertySymOpnd->HasFinalType())","propertySymOpnd->HasFinalType()"
                      );
    if (!bVar2) goto LAB_005cc693;
    *puVar4 = 0;
  }
  bVar2 = IR::PropertySymOpnd::HasInitialType(propertySymOpnd);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2098,"(propertySymOpnd->HasInitialType())",
                       "propertySymOpnd->HasInitialType()");
    if (!bVar2) goto LAB_005cc693;
    *puVar4 = 0;
  }
  if (((propertySymOpnd->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x209d,"(!propertySymOpnd->IsTypeChecked())",
                       "Why are we doing a type transition when we have the type we want?");
    if (!bVar2) goto LAB_005cc693;
    *puVar4 = 0;
  }
  if ((instrStFld->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x20a0,"(instrStFld->HasBailOutInfo())","instrStFld->HasBailOutInfo()");
    if (!bVar2) goto LAB_005cc693;
    *puVar4 = 0;
  }
  labelTypeCheckFailed = IR::LabelInstr::New(Label,this->m_func,true);
  GenerateCachedTypeWithoutPropertyCheck
            (this,instrStFld,propertySymOpnd,(Opnd *)0x0,labelTypeCheckFailed);
  initialType = IR::PropertySymOpnd::GetInitialType(propertySymOpnd);
  GenerateFieldStoreWithTypeChange
            (this,instrStFld,propertySymOpnd,initialType,(propertySymOpnd->finalType).t);
  IR::Instr::FreeSrc1(instrStFld);
  IR::Instr::FreeDst(instrStFld);
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  instr = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
  IR::Instr::InsertBefore(instrStFld,&instr->super_Instr);
  if ((instrStFld->field_0x38 & 0x10) == 0) {
    IR::Instr::InsertAfter(instrStFld,&branchTarget->super_Instr);
    IR::Instr::Remove(instrStFld);
  }
  else {
    if (labelTypeCheckFailed == (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x20b1,"(labelBailOut != nullptr)","labelBailOut != nullptr");
      if (!bVar2) {
LAB_005cc693:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    IR::Instr::InsertBefore(instrStFld,&labelTypeCheckFailed->super_Instr);
    IR::Instr::InsertAfter(instrStFld,&branchTarget->super_Instr);
    instrStFld->m_opcode = BailOut;
    GenerateBailOut(this,instrStFld,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateStFldWithCachedFinalType(IR::Instr * instrStFld, IR::PropertySymOpnd *propertySymOpnd)
{
    // This function tries to treat a sequence of add-property stores as a single type transition.
    Assert(propertySymOpnd == instrStFld->GetDst()->AsPropertySymOpnd());
    Assert(propertySymOpnd->IsMonoObjTypeSpecCandidate());
    Assert(propertySymOpnd->HasFinalType());
    Assert(propertySymOpnd->HasInitialType());

    IR::Instr *instr;
    IR::LabelInstr *labelBailOut = nullptr;

    AssertMsg(!propertySymOpnd->IsTypeChecked(), "Why are we doing a type transition when we have the type we want?");

    // If the initial type must be checked here, do it.
    Assert(instrStFld->HasBailOutInfo());
    labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    GenerateCachedTypeWithoutPropertyCheck(instrStFld, propertySymOpnd, nullptr/*typeOpnd*/, labelBailOut);

    // Do the type transition.
    GenerateFieldStoreWithTypeChange(instrStFld, propertySymOpnd, propertySymOpnd->GetInitialType(), propertySymOpnd->GetFinalType());

    instrStFld->FreeSrc1();
    instrStFld->FreeDst();

    // Insert the bailout and let the main path branch around it.
    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    instrStFld->InsertBefore(instr);

    if (instrStFld->HasBailOutInfo())
    {
        Assert(labelBailOut != nullptr);
        instrStFld->InsertBefore(labelBailOut);
        instrStFld->InsertAfter(labelDone);

        instrStFld->m_opcode = Js::OpCode::BailOut;
        this->GenerateBailOut(instrStFld);
    }
    else
    {
        instrStFld->InsertAfter(labelDone);
        instrStFld->Remove();
    }

    return true;
}